

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_codec.c
# Opt level: O0

void aom_set_error(aom_internal_error_info *info,aom_codec_err_t error,char *fmt,...)

{
  aom_internal_error_info *in_RCX;
  va_list ap;
  __va_list_tag *in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  aom_codec_err_t in_stack_ffffffffffffff2c;
  
  set_error(in_RCX,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  return;
}

Assistant:

void aom_set_error(struct aom_internal_error_info *info, aom_codec_err_t error,
                   const char *fmt, ...) {
  va_list ap;

  va_start(ap, fmt);
  set_error(info, error, fmt, ap);
  va_end(ap);

  assert(!info->setjmp);
}